

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_maybe.cpp
# Opt level: O3

void __thiscall Maybe_Emplace_Test::~Maybe_Emplace_Test(Maybe_Emplace_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (Maybe, Emplace) {
    maybe<no_copy_value> m;
    EXPECT_EQ (m.emplace (13).get (), 13);
    EXPECT_TRUE (m.has_value ());
    EXPECT_EQ (m.value ().get (), 13);

    EXPECT_EQ (m.emplace (17).get (), 17);
    EXPECT_TRUE (m.has_value ());
    EXPECT_EQ (m.value ().get (), 17);
}